

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryReplaceNode
          (DiskHandle *this,PathPtr path,WriteMode mode,Function<int_(kj::StringPtr)> *tryCreate)

{
  Iface *pIVar1;
  PathPtr finalName;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  PathPtr PVar6;
  StringPtr toPath;
  StringPtr fromPath;
  PathPtr path_local;
  Fault f_2;
  String tempPath;
  String filename;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_58;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_48;
  
  path_local.parts.size_ = path.parts.size_;
  path_local.parts.ptr = path.parts.ptr;
  if (path_local.parts.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&filename,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3b2,FAILED,(char *)0x0,"\"can\'t replace self\"",
               (char (*) [19])"can\'t replace self");
    kj::_::Debug::Fault::~Fault((Fault *)&filename);
    return false;
  }
  PathPtr::toString(&filename,&path_local,false);
  if ((mode & CREATE) == 0) {
LAB_003c1165:
    finalName.parts.size_ = path_local.parts.size_;
    finalName.parts.ptr = path_local.parts.ptr;
    local_58.disposer = (tryCreate->impl).disposer;
    local_58.ptr = (tryCreate->impl).ptr;
    (tryCreate->impl).ptr = (Iface *)0x0;
    createNamedTemporary(&tempPath,this,finalName,mode,(Function<int_(kj::StringPtr)> *)&local_58);
    Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_58);
    pcVar4 = "";
    if (filename.content.size_ != 0) {
      pcVar4 = filename.content.ptr;
    }
    toPath.content.size_ = filename.content.size_ + (filename.content.size_ == 0);
    pcVar5 = "";
    if (tempPath.content.size_ != 0) {
      pcVar5 = tempPath.content.ptr;
    }
    fromPath.content.size_ = tempPath.content.size_ + (tempPath.content.size_ == 0);
    toPath.content.ptr = pcVar4;
    fromPath.content.ptr = pcVar5;
    bVar2 = tryCommitReplacement(this,toPath,(this->fd).fd,fromPath,mode,(int *)0x0);
    if (!bVar2) {
      do {
        pcVar4 = "";
        if (tempPath.content.size_ != 0) {
          pcVar4 = tempPath.content.ptr;
        }
        iVar3 = unlinkat((this->fd).fd,pcVar4,0);
        if (-1 < iVar3) goto LAB_003c122d;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if ((iVar3 != 0) && (iVar3 != 2)) {
        kj::_::Debug::Fault::Fault<int,kj::String&>
                  (&f_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x3de,iVar3,"unlinkat(fd, tempPath, 0)","tempPath",&tempPath);
        kj::_::Debug::Fault::fatal(&f_2);
      }
    }
LAB_003c122d:
    Array<char>::~Array(&tempPath.content);
    goto LAB_003c1387;
  }
  do {
    pcVar4 = "";
    if (filename.content.size_ != 0) {
      pcVar4 = filename.content.ptr;
    }
    pIVar1 = (tryCreate->impl).ptr;
    iVar3 = (**pIVar1->_vptr_Iface)
                      (pIVar1,pcVar4,filename.content.size_ + (filename.content.size_ == 0));
    bVar2 = true;
    if (-1 < iVar3) goto LAB_003c1387;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 == 0) goto LAB_003c1387;
  if (iVar3 == 2) {
    if (((mode & CREATE_PARENT) != 0) && (path_local.parts.size_ != 0)) {
      PVar6 = PathPtr::parent(&path_local);
      bVar2 = tryMkdir(this,PVar6,CREATE_PARENT|MODIFY|CREATE,true);
      if (bVar2) {
        PVar6.parts.size_ = path_local.parts.size_;
        PVar6.parts.ptr = path_local.parts.ptr;
        local_48.disposer = (tryCreate->impl).disposer;
        local_48.ptr = (tryCreate->impl).ptr;
        (tryCreate->impl).ptr = (Iface *)0x0;
        bVar2 = tryReplaceNode(this,PVar6,mode & ~CREATE_PARENT,
                               (Function<int_(kj::StringPtr)> *)&local_48);
        Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_48);
        goto LAB_003c1387;
      }
    }
LAB_003c134a:
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&tempPath,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x3cb,iVar3,"create(path)","path",&path_local);
    kj::_::Debug::Fault::~Fault((Fault *)&tempPath);
  }
  else {
    if (iVar3 != 0x11) goto LAB_003c134a;
    if ((mode & MODIFY) != 0) goto LAB_003c1165;
  }
  bVar2 = false;
LAB_003c1387:
  Array<char>::~Array(&filename.content);
  return bVar2;
}

Assistant:

bool tryReplaceNode(PathPtr path, WriteMode mode, Function<int(StringPtr)> tryCreate) const {
    // Replaces the given path with an object created by calling tryCreate().
    //
    // tryCreate() must behave like a syscall which creates the node at the path passed to it,
    // returning a negative value on error. If the path passed to tryCreate already exists, it
    // MUST fail with EEXIST.
    //
    // When `mode` includes MODIFY, replaceNode() reacts to EEXIST by creating the node in a
    // temporary location and then rename()ing it into place.

    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { return false; }
    }

    auto filename = path.toString();

    if (has(mode, WriteMode::CREATE)) {
      // First try just creating the node in-place.
      KJ_SYSCALL_HANDLE_ERRORS(tryCreate(filename)) {
        case EEXIST:
          // Target exists.
          if (has(mode, WriteMode::MODIFY)) {
            // Fall back to MODIFY path, below.
            break;
          } else {
            return false;
          }
        case ENOENT:
          if (has(mode, WriteMode::CREATE_PARENT) && path.size() > 0 &&
              tryMkdir(path.parent(), WriteMode::CREATE | WriteMode::MODIFY |
                                      WriteMode::CREATE_PARENT, true)) {
            // Retry, but make sure we don't try to create the parent again.
            return tryReplaceNode(path, mode - WriteMode::CREATE_PARENT, kj::mv(tryCreate));
          }
          KJ_FALLTHROUGH;
        default:
          KJ_FAIL_SYSCALL("create(path)", error, path) { return false; }
      } else {
        // Success.
        return true;
      }
    }

    // Either we don't have CREATE mode or the target already exists. We need to perform a
    // replacement instead.

    auto tempPath = createNamedTemporary(path, mode, kj::mv(tryCreate));
    if (tryCommitReplacement(filename, fd, tempPath, mode)) {
      return true;
    } else {
      KJ_SYSCALL_HANDLE_ERRORS(unlinkat(fd, tempPath.cStr(), 0)) {
        case ENOENT:
          // meh
          break;
        default:
          KJ_FAIL_SYSCALL("unlinkat(fd, tempPath, 0)", error, tempPath);
      }
      return false;
    }
  }